

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::ColoredWriteToStdout(LogSeverity severity,char *message,size_t len)

{
  undefined8 local_28;
  FILE *output;
  size_t len_local;
  char *message_local;
  LogSeverity severity_local;
  
  local_28 = _stdout;
  if (fLI::FLAGS_stderrthreshold <= (int)severity) {
    local_28 = _stderr;
  }
  ColoredWriteToStderrOrStdout(local_28,severity,message,len);
  return;
}

Assistant:

static void ColoredWriteToStdout(LogSeverity severity, const char* message,
                                 size_t len) {
  FILE* output = stdout;
  // We also need to send logs to the stderr when the severity is
  // higher or equal to the stderr threshold.
  if (severity >= FLAGS_stderrthreshold) {
    output = stderr;
  }
  ColoredWriteToStderrOrStdout(output, severity, message, len);
}